

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O0

void __thiscall
sptk::reaper::EpochTracker::CrossCorrelation
          (EpochTracker *this,vector<float,_std::allocator<float>_> *data,int32_t start,
          int32_t first_lag,int32_t n_lags,int32_t size,vector<float,_std::allocator<float>_> *corr)

{
  int iVar1;
  const_reference pvVar2;
  reference pvVar3;
  int in_ECX;
  int in_EDX;
  int in_R8D;
  int in_R9D;
  float fVar4;
  double dVar5;
  vector<float,_std::allocator<float>_> *in_stack_00000008;
  int32_t i_3;
  int32_t lag_ind;
  float sum;
  int32_t lag;
  int32_t oind;
  int32_t last_lag;
  int32_t i_2;
  double lag_energy;
  int32_t limit;
  int32_t i_1;
  int32_t i;
  float energy;
  float *input;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int iVar6;
  int local_58;
  float local_54;
  int local_50;
  int local_4c;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffffc0;
  double dVar7;
  int local_34;
  int local_30;
  float local_2c;
  
  pvVar2 = std::vector<float,_std::allocator<float>_>::front
                     ((vector<float,_std::allocator<float>_> *)
                      CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::vector<float,_std::allocator<float>_>::resize
            (in_stack_ffffffffffffffc0,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
            );
  local_2c = 0.0;
  for (local_30 = 0; local_30 < in_R9D; local_30 = local_30 + 1) {
    local_2c = pvVar2[(long)in_EDX + (long)local_30] * pvVar2[(long)in_EDX + (long)local_30] +
               local_2c;
  }
  if ((local_2c != 0.0) || (NAN(local_2c))) {
    dVar7 = 0.0;
    for (iVar1 = in_ECX; iVar1 < in_ECX + in_R9D; iVar1 = iVar1 + 1) {
      dVar7 = (double)(pvVar2[(long)in_EDX + (long)iVar1] * pvVar2[(long)in_EDX + (long)iVar1]) +
              dVar7;
    }
    iVar1 = in_ECX + in_R8D;
    local_4c = 0;
    for (local_50 = in_ECX; local_50 < iVar1; local_50 = local_50 + 1) {
      local_54 = 0.0;
      local_58 = local_50;
      for (iVar6 = 0; iVar6 < in_R9D; iVar6 = iVar6 + 1) {
        local_54 = pvVar2[(long)in_EDX + (long)iVar6] * pvVar2[(long)in_EDX + (long)local_58] +
                   local_54;
        local_58 = local_58 + 1;
      }
      if (dVar7 <= 0.0) {
        dVar7 = 1.0;
      }
      dVar5 = sqrt((double)local_2c * dVar7);
      fVar4 = (float)((double)local_54 / dVar5);
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         (in_stack_00000008,(long)local_4c);
      *pvVar3 = fVar4;
      dVar7 = (double)(pvVar2[(long)in_EDX + (long)local_58] * pvVar2[(long)in_EDX + (long)local_58]
                      ) +
              (dVar7 - (double)(pvVar2[(long)in_EDX + (long)local_50] *
                               pvVar2[(long)in_EDX + (long)local_50]));
      local_4c = local_4c + 1;
    }
  }
  else {
    for (local_34 = 0; local_34 < in_R8D; local_34 = local_34 + 1) {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         (in_stack_00000008,(long)local_34);
      *pvVar3 = 0.0;
    }
  }
  return;
}

Assistant:

void EpochTracker::CrossCorrelation(const std::vector<float>& data, int32_t start,
                                    int32_t first_lag, int32_t n_lags,
                                    int32_t size, std::vector<float>* corr) {
  const float* input = (&(data.front())) + start;
  corr->resize(n_lags);
  float energy = 0.0;  // Zero-lag energy part of the normalizer.
  for (int32_t i = 0; i < size; ++i) {
    energy += input[i] * input[i];
  }
  if (energy == 0.0) {  // Bail out if no energy is found.
    for (int32_t i = 0; i < n_lags; ++i) {
      (*corr)[i] = 0.0;
    }
    return;
  }
  int32_t limit = first_lag + size;
  double lag_energy = 0.0;  // Energy at the period hypothesis lag.
  for (int32_t i = first_lag; i < limit; ++i) {
    lag_energy += input[i] * input[i];
  }
  int32_t last_lag = first_lag + n_lags;
  int32_t oind = 0;  // Index for storing output values.
  for (int32_t lag = first_lag; lag < last_lag; ++lag, ++oind) {
    float sum = 0.0;
    int32_t lag_ind = lag;
    for (int32_t i = 0; i < size; ++i, ++lag_ind) {
      sum += input[i] * input[lag_ind];
    }
    if (lag_energy <= 0.0)
      lag_energy = 1.0;
    (*corr)[oind] = sum / sqrt(energy * lag_energy);
    lag_energy -= input[lag] * input[lag];  // Discard old sample.
    lag_energy += input[lag_ind] * input[lag_ind];  // Pick up the new sample.
  }
  return;
}